

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint32_t id;
  pointer puVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  StorageClass SVar19;
  uint uVar20;
  AddressingModel AVar21;
  int32_t iVar22;
  uint32_t uVar23;
  spv_result_t sVar24;
  uint uVar25;
  int iVar26;
  TensorAddressingOperandsMask TVar27;
  uint uVar28;
  size_t i;
  char *pcVar29;
  Instruction *pIVar30;
  Instruction *pIVar31;
  Instruction *pIVar32;
  Instruction *pIVar33;
  Function *pFVar34;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint16_t uVar35;
  bool bVar36;
  bool bVar37;
  size_t sVar38;
  bool bVar39;
  Op opcode;
  ulong uVar40;
  string *__return_storage_ptr__;
  long lVar41;
  char *local_2a0;
  string instr_name;
  anon_class_24_3_e757d3e0 ValidateType;
  uint64_t stride_value;
  uint32_t data_type;
  undefined8 local_218;
  undefined8 local_210;
  string errorVUID;
  spv_result_t local_38;
  
  uVar2 = (inst->inst_).opcode;
  opcode = (Op)uVar2;
  switch(uVar2) {
  case 0x3b:
switchD_00179ead_caseD_1142:
    sVar24 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_00179ecd_caseD_14f1;
  case 0x3d:
    pIVar30 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar30 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
      uVar23 = (inst->inst_).type_id;
      goto LAB_0017aca4;
    }
    uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar31 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar31 == (Instruction *)0x0) {
LAB_0017b135:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Pointer <id> ");
      goto LAB_0017b16b;
    }
    AVar21 = ValidationState_t::addressing_model(_);
    if (AVar21 == AddressingModelLogical) {
      bVar7 = (_->features_).variable_pointers;
      if ((bool)bVar7 == false) {
        iVar22 = spvOpcodeReturnsLogicalPointer((uint)(pIVar31->inst_).opcode);
        if (iVar22 == 0) goto LAB_0017b135;
        bVar7 = (_->features_).variable_pointers;
      }
      if (((bVar7 & 1) != 0) &&
         (bVar18 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar31->inst_).opcode), !bVar18))
      goto LAB_0017b135;
    }
    pIVar33 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
    if (pIVar33 == (Instruction *)0x0) {
LAB_0017a383:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad type for pointer <id> ");
      goto LAB_0017a9f2;
    }
    uVar35 = (pIVar33->inst_).opcode;
    if (uVar35 != 0x20) {
      if (uVar35 != 0x1141) goto LAB_0017a383;
LAB_0017b742:
      if ((_->options_->before_hlsl_legalization == false) &&
         (bVar18 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar18)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar29 = "Cannot load a runtime-sized array";
      }
      else {
        sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
        if (sVar24 != SPV_SUCCESS) {
          return sVar24;
        }
        bVar18 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (((!bVar18) ||
            (bVar18 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
            !bVar18)) ||
           ((uVar40 = (ulong)(pIVar30->inst_).opcode, uVar40 < 0x21 &&
            ((0x101e00000U >> (uVar40 & 0x3f) & 1) != 0)))) {
          ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                    (_,uVar20,inst,(Instruction *)0x0);
          goto switchD_00179ecd_caseD_14f1;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar29 = "8- or 16-bit loads must be a scalar, vector or matrix type";
      }
      goto LAB_0017b4a0;
    }
    uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar33,2);
    pIVar33 = ValidationState_t::FindDef(_,uVar25);
    if ((pIVar33 != (Instruction *)0x0) &&
       ((pIVar30->inst_).result_id == (pIVar33->inst_).result_id)) goto LAB_0017b742;
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
    std::operator<<((ostream *)&errorVUID," does not match Pointer <id> ");
    uVar23 = (pIVar31->inst_).result_id;
LAB_0017ba53:
    __return_storage_ptr__ = (string *)&ValidateType;
LAB_0017ba58:
    ValidationState_t::getIdName_abi_cxx11_(__return_storage_ptr__,_,uVar23);
    std::operator<<((ostream *)&errorVUID,(string *)__return_storage_ptr__);
    pcVar29 = "s type.";
LAB_0017ba75:
    std::operator<<((ostream *)&errorVUID,pcVar29);
    std::__cxx11::string::_M_dispose();
    goto LAB_0017b04d;
  case 0x3e:
    uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar30 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar30 == (Instruction *)0x0) {
LAB_0017adc4:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
      goto LAB_0017ae9e;
    }
    AVar21 = ValidationState_t::addressing_model(_);
    if (AVar21 == AddressingModelLogical) {
      bVar7 = (_->features_).variable_pointers;
      if ((bool)bVar7 == false) {
        iVar22 = spvOpcodeReturnsLogicalPointer((uint)(pIVar30->inst_).opcode);
        if (iVar22 == 0) goto LAB_0017adc4;
        bVar7 = (_->features_).variable_pointers;
      }
      if (((bVar7 & 1) != 0) &&
         (bVar18 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar30->inst_).opcode), !bVar18))
      goto LAB_0017adc4;
    }
    pIVar31 = ValidationState_t::FindDef(_,(pIVar30->inst_).type_id);
    if (pIVar31 != (Instruction *)0x0) {
      uVar35 = (pIVar31->inst_).opcode;
      if (uVar35 == 0x20) {
        uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar33 = ValidationState_t::FindDef(_,uVar25);
        if ((pIVar33 != (Instruction *)0x0) && ((pIVar33->inst_).opcode != 0x13)) goto LAB_0017b217;
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
LAB_0017b1fb:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = "s type is void.";
      }
      else {
        if (uVar35 != 0x1141) goto LAB_0017ad05;
        pIVar33 = (Instruction *)0x0;
LAB_0017b217:
        bVar18 = ValidationState_t::GetPointerTypeInfo
                           (_,(pIVar31->inst_).result_id,&data_type,(StorageClass *)&stride_value);
        if (bVar18) {
          if (((uint)stride_value < 10) && ((0x203U >> ((uint)stride_value & 0x1f) & 1) != 0)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar29 = " storage class is read-only";
          }
          else {
            if ((uint)stride_value == 0x14db) {
              ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x125f,(char *)0x0);
              pFVar34 = ValidationState_t::function(_,inst->function_->id_);
              std::__cxx11::string::string((string *)&instr_name,(string *)&errorVUID);
              ValidateType.inst = (Instruction **)0x0;
              ValidateType._ = (ValidationState_t *)operator_new(0x20);
              (ValidateType._)->context_ = (spv_const_context)&(ValidateType._)->words_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)instr_name._M_dataplus._M_p == &instr_name.field_2) {
                (ValidateType._)->words_ =
                     (uint32_t *)
                     CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                              instr_name.field_2._M_local_buf[0]);
                (ValidateType._)->num_words_ = instr_name.field_2._8_8_;
              }
              else {
                (ValidateType._)->context_ = (spv_const_context)instr_name._M_dataplus._M_p;
                (ValidateType._)->words_ =
                     (uint32_t *)
                     CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                              instr_name.field_2._M_local_buf[0]);
              }
              (ValidateType._)->options_ = (spv_const_validator_options)instr_name._M_string_length;
              instr_name._M_string_length = 0;
              instr_name.field_2._M_local_buf[0] = '\0';
              ValidateType.instr_name =
                   (string *)
                   std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1088:15)>
                   ::_M_manager;
              instr_name._M_dataplus._M_p = (pointer)&instr_name.field_2;
              std::__cxx11::
              list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ::push_back(&pFVar34->execution_model_limitations_,(value_type *)&ValidateType);
              if (ValidateType.instr_name != (string *)0x0) {
                (*(code *)ValidateType.instr_name)(&ValidateType,&ValidateType,3);
              }
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            else if ((uint)stride_value == 0x14df) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              pcVar29 = "ShaderRecordBufferKHR Storage Class variables are read only";
              goto LAB_0017b4a0;
            }
            bVar18 = spvIsVulkanEnv(_->context_->target_env);
            if (((bVar18) && ((uint)stride_value == 2)) &&
               (pIVar30 = ValidationState_t::TracePointer(_,pIVar30),
               (pIVar30->inst_).opcode == 0x3b)) {
              uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,0);
              pIVar30 = ValidationState_t::FindDef(_,uVar25);
              uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
              pIVar30 = ValidationState_t::FindDef(_,uVar25);
              if (((pIVar30->inst_).opcode & 0xfffe) == 0x1c) {
                uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1);
                pIVar30 = ValidationState_t::FindDef(_,uVar25);
              }
              bVar18 = ValidationState_t::HasDecoration(_,(pIVar30->inst_).result_id,Block);
              if (bVar18) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1b0d,(char *)0x0);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar29 = "In the Vulkan environment, cannot store to Uniform Blocks";
                goto LAB_0017b03e;
              }
            }
            uVar25 = Instruction::GetOperandAs<unsigned_int>(inst,1);
            pIVar30 = ValidationState_t::FindDef(_,uVar25);
            if ((pIVar30 != (Instruction *)0x0) && (uVar23 = (pIVar30->inst_).type_id, uVar23 != 0))
            {
              pIVar31 = ValidationState_t::FindDef(_,uVar23);
              if ((pIVar31 == (Instruction *)0x0) ||
                 (uVar35 = (pIVar31->inst_).opcode, uVar35 == 0x13)) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
                uVar20 = uVar25;
                goto LAB_0017b1fb;
              }
              if ((pIVar33 != (Instruction *)0x0) &&
                 ((pIVar33->inst_).result_id != (pIVar31->inst_).result_id)) {
                if ((_->options_->relax_struct_store != true) ||
                   ((uVar35 != 0x1e || ((pIVar33->inst_).opcode != 0x1e)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                  ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  std::operator<<((ostream *)&errorVUID,"s type does not match Object <id> ");
                  uVar23 = (pIVar30->inst_).result_id;
                  __return_storage_ptr__ = (string *)&data_type;
                  goto LAB_0017ba58;
                }
                bVar18 = anon_unknown_2::AreLayoutCompatibleStructs(_,pIVar33,pIVar31);
                if (!bVar18) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                  ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  std::operator<<((ostream *)&errorVUID,"s layout does not match Object <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&data_type,_,(pIVar30->inst_).result_id);
                  std::operator<<((ostream *)&errorVUID,(string *)&data_type);
                  pcVar29 = "s layout.";
                  goto LAB_0017ba75;
                }
              }
              sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
              if (sVar24 != SPV_SUCCESS) {
                return sVar24;
              }
              bVar18 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader)
              ;
              if (((bVar18) &&
                  (bVar18 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                      (_,(inst->inst_).type_id), bVar18)) &&
                 ((uVar40 = (ulong)(pIVar31->inst_).opcode, 0x20 < uVar40 ||
                  ((0x101e00000U >> (uVar40 & 0x3f) & 1) == 0)))) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar29 = "8- or 16-bit stores must be a scalar, vector or matrix type";
                goto LAB_0017b4a0;
              }
              bVar18 = spvIsVulkanEnv(_->context_->target_env);
              if ((bVar18) && (_->options_->before_hlsl_legalization == false)) {
                errorVUID._M_dataplus._M_p = (pointer)0x0;
                errorVUID._M_string_length = 0;
                errorVUID.field_2._8_8_ =
                     std::
                     _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                     ::_M_invoke;
                errorVUID.field_2._M_allocated_capacity =
                     (size_type)
                     std::
                     _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                     ::_M_manager;
                bVar18 = ValidationState_t::ContainsType
                                   (_,(pIVar31->inst_).result_id,
                                    (function<bool_(const_spvtools::val::Instruction_*)> *)
                                    &errorVUID,true);
                if (errorVUID.field_2._M_allocated_capacity != 0) {
                  (*(code *)errorVUID.field_2._M_allocated_capacity)(&errorVUID,&errorVUID,3);
                }
                if (bVar18) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1b0c,(char *)0x0);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  pcVar29 = 
                  "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
                  ;
                  goto LAB_0017b03e;
                }
              }
              goto switchD_00179ecd_caseD_14f1;
            }
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar25);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar29 = " is not an object.";
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar29 = " is not pointer type";
        }
      }
      goto LAB_0017b03e;
    }
LAB_0017ad05:
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&errorVUID,"OpStore type for pointer <id> ");
    goto LAB_0017ad3a;
  case 0x3f:
  case 0x40:
    uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar30 = ValidationState_t::FindDef(_,uVar23);
    if (pIVar30 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
LAB_0017aca4:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = " is not defined.";
      goto LAB_0017b03e;
    }
    uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar31 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar31 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      pcVar29 = "Source operand <id> ";
      uVar23 = uVar20;
LAB_0017ab43:
      std::operator<<((ostream *)&errorVUID,pcVar29);
      goto LAB_0017aca4;
    }
    pIVar30 = ValidationState_t::FindDef(_,(pIVar30->inst_).type_id);
    if ((pIVar30 == (Instruction *)0x0) ||
       ((uVar35 = (pIVar30->inst_).opcode, uVar35 != 0x20 && (uVar35 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
LAB_0017b027:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = " is not a pointer.";
      goto LAB_0017b03e;
    }
    pIVar31 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
    if ((pIVar31 == (Instruction *)0x0) ||
       ((uVar35 = (pIVar31->inst_).opcode, uVar35 != 0x20 && (uVar35 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
      uVar23 = uVar20;
      goto LAB_0017b027;
    }
    if ((inst->inst_).opcode == 0x3f) {
      if ((pIVar30->inst_).opcode == 0x20) {
        uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
        pIVar33 = ValidationState_t::FindDef(_,uVar25);
        if ((pIVar33 != (Instruction *)0x0) && ((pIVar33->inst_).opcode != 0x13)) {
          if (uVar35 == 0x20) goto LAB_0017c10d;
LAB_0017c40d:
          uVar23 = 2;
LAB_0017cd71:
          sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar23);
          if (sVar24 != SPV_SUCCESS) {
            return sVar24;
          }
          uVar2 = (inst->inst_).opcode;
          if (1 < uVar2 - 0x3f) {
            __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp"
                          ,0x4ab,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                         );
          }
          uVar20 = uVar2 == 0x3f ^ 3;
          if ((ulong)uVar20 <
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20);
            if (sVar24 != SPV_SUCCESS) {
              return sVar24;
            }
            uVar25 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar20);
            iVar26 = anon_unknown_2::MemoryAccessNumWords(uVar25);
            uVar20 = iVar26 + uVar20;
            if ((ulong)uVar20 <
                (ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
              if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
                sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20);
                if (sVar24 != SPV_SUCCESS) {
                  return sVar24;
                }
                if ((uVar25 & 0x10) == 0) {
                  uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar20);
                  if ((uVar20 & 8) == 0) goto LAB_0017cf15;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar29 = "Source memory access must not include MakePointerAvailableKHR";
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar29 = "Target memory access must not include MakePointerVisibleKHR";
                }
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar29 = spvOpcodeString((uint)(inst->inst_).opcode);
                std::operator<<((ostream *)&errorVUID,pcVar29);
                pcVar29 = " with two memory access operands requires SPIR-V 1.4 or later";
              }
              std::operator<<((ostream *)&errorVUID,pcVar29);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
              if (local_38 != SPV_SUCCESS) {
                return local_38;
              }
            }
          }
LAB_0017cf15:
          if ((pIVar30->inst_).opcode == 0x20) {
            do {
              uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
              pIVar30 = ValidationState_t::FindDef(_,uVar20);
            } while ((pIVar30->inst_).opcode == 0x20);
            bVar18 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if ((bVar18) &&
               (bVar18 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                   (_,(pIVar30->inst_).result_id), bVar18)) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              pcVar29 = "Cannot copy memory of objects containing 8- or 16-bit types";
              goto LAB_0017b4a0;
            }
          }
          goto switchD_00179ecd_caseD_14f1;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
        uVar20 = uVar23;
      }
      else {
        if (uVar35 != 0x20) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = "One of Source or Target must be a typed pointer";
          goto LAB_0017b4a0;
        }
        pIVar33 = (Instruction *)0x0;
LAB_0017c10d:
        uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar31 = ValidationState_t::FindDef(_,uVar25);
        if ((pIVar31 != (Instruction *)0x0) && ((pIVar31->inst_).opcode != 0x13)) {
          if ((pIVar33 == (Instruction *)0x0) ||
             ((pIVar33->inst_).result_id == (pIVar31->inst_).result_id)) goto LAB_0017c40d;
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"Target <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID,"s type does not match Source <id> ");
          uVar23 = (pIVar31->inst_).result_id;
          goto LAB_0017ba53;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
      }
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = " cannot be a void pointer.";
      goto LAB_0017b03e;
    }
    uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar33 = ValidationState_t::FindDef(_,uVar23);
    if (pIVar33 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      pcVar29 = "Size operand <id> ";
      goto LAB_0017ab43;
    }
    pIVar32 = ValidationState_t::FindDef(_,(pIVar33->inst_).type_id);
    bVar18 = ValidationState_t::IsIntScalarType(_,(pIVar32->inst_).result_id);
    if (bVar18) {
      uVar35 = (pIVar33->inst_).opcode;
      if (uVar35 == 0x2b) {
        if (((pIVar32->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[3] != 1) ||
           (-1 < (int)(pIVar33->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1])) {
          uVar40 = 3;
          bVar18 = true;
          while (bVar18) {
            puVar4 = (pIVar33->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pIVar33->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <=
                uVar40) goto LAB_0017b856;
            bVar18 = puVar4[uVar40] == 0;
            uVar40 = uVar40 + 1;
          }
          goto LAB_0017c285;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " cannot have the sign bit set to 1.";
      }
      else {
        if (uVar35 != 0x2e) {
LAB_0017c285:
          pCVar1 = &_->module_capabilities_;
          bVar18 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
          if (bVar18) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)&errorVUID,_,uVar23);
            _Var5 = errorVUID._M_dataplus;
            if ((((ulong)errorVUID._M_dataplus._M_p & 3) != 0 & errorVUID._M_dataplus._M_p._4_1_) ==
                1) {
              SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
              local_218 = CONCAT44(extraout_var,SVar19);
              SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar30,1);
              local_210 = CONCAT44(extraout_var_00,SVar19);
              bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
              bVar9 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
              bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess);
              bVar10 = bVar10 || bVar9;
              bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
              bVar12 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
              bVar13 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
              bVar14 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
              bVar18 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer16BitAccess)
              ;
              bVar36 = (bVar18 || bVar14) || bVar10;
              bVar15 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
              bVar16 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageInputOutput16);
              bVar17 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
              bVar18 = false;
              bVar6 = false;
              switch((int)local_218) {
              case 1:
              case 3:
                bVar18 = bVar16;
                bVar6 = false;
                break;
              case 2:
                bVar18 = bVar9 || bVar14;
                bVar6 = bVar9;
                break;
              case 4:
                bVar18 = bVar17;
                bVar6 = bVar12;
                break;
              case 5:
              case 6:
              case 7:
              case 8:
              case 10:
              case 0xb:
                break;
              case 9:
                bVar18 = bVar15 || bVar11;
                bVar6 = bVar11;
                break;
              case 0xc:
                bVar18 = bVar36;
                bVar6 = bVar10;
                break;
              default:
                bVar6 = false;
              }
              bVar37 = false;
              bVar39 = false;
              switch((int)local_210) {
              case 2:
                bVar37 = bVar9 || bVar14;
                bVar39 = bVar9;
                break;
              case 3:
                bVar37 = bVar16;
                bVar39 = false;
                break;
              case 4:
                bVar37 = bVar17;
                bVar39 = bVar12;
                break;
              case 5:
              case 6:
              case 7:
              case 8:
              case 10:
              case 0xb:
                break;
              case 9:
                bVar37 = bVar15 || bVar11;
                bVar39 = bVar11;
                break;
              case 0xc:
                bVar37 = bVar36;
                bVar39 = bVar10;
                break;
              default:
                bVar37 = false;
                bVar39 = false;
              }
              if ((bVar13 || (bVar18 & bVar37) != 0) || bVar8) {
                if ((bVar8 || (bVar6 & bVar39) != 0) || ((ulong)_Var5._M_p & 1) == 0)
                goto LAB_0017cd6f;
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar29 = "Size must be a multiple of 2";
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar29 = "Size must be a multiple of 4";
              }
              goto LAB_0017b4a0;
            }
          }
LAB_0017cd6f:
          uVar23 = 3;
          goto LAB_0017cd71;
        }
LAB_0017b856:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " cannot be a constant zero.";
      }
      goto LAB_0017b03e;
    }
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
    goto LAB_0017bf00;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_00179ead_caseD_1143:
    sVar24 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_00179ead_caseD_1147:
    AVar21 = ValidationState_t::addressing_model(_);
    if (((AVar21 != AddressingModelLogical) || ((inst->inst_).opcode != 0x43)) ||
       ((_->features_).variable_pointers != false)) {
      sVar24 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar24 != SPV_SUCCESS) {
        return sVar24;
      }
      bVar18 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if (bVar18) {
        uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      }
      else {
        uVar23 = (pIVar30->inst_).type_id;
      }
      pIVar30 = ValidationState_t::FindDef(_,uVar23);
      SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar30,1);
      pCVar1 = &_->module_capabilities_;
      bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
      if ((bVar6) &&
         ((((SVar19 < (StorageBuffer|Input) && ((0x1204U >> (SVar19 & 0x1f) & 1) != 0)) ||
           ((SVar19 == PhysicalStorageBuffer ||
            ((bVar6 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar19 == StorageClassWorkgroup && (bVar6)))))) &&
          (bVar6 = ValidationState_t::HasDecoration(_,(pIVar30->inst_).result_id,ArrayStride),
          !bVar6)))) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar29 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
        goto LAB_0017b4a0;
      }
      bVar6 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar6) goto switchD_00179ecd_caseD_14f1;
      if (bVar18) {
        bVar18 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
      }
      else {
        bVar18 = false;
      }
      if (SVar19 == PhysicalStorageBuffer) goto switchD_00179ecd_caseD_14f1;
      if (SVar19 == StorageBuffer) {
        if (bVar18 == false && (_->features_).variable_pointers == false) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de4,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar29 = 
          "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
          ;
          goto LAB_0017b03e;
        }
        goto switchD_00179ecd_caseD_14f1;
      }
      if (SVar19 != StorageClassWorkgroup) {
        if (bVar18 == false) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de2,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar29 = 
          "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
          ;
          goto LAB_0017b03e;
        }
        goto switchD_00179ecd_caseD_14f1;
      }
      bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
      if (bVar18 != false || bVar6) goto switchD_00179ecd_caseD_14f1;
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de3,(char *)0x0);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = 
      "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
      ;
      goto LAB_0017b03e;
    }
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&errorVUID,"Generating variable pointers requires capability ");
    pcVar29 = "VariablePointers or VariablePointersStorageBuffer";
    goto LAB_0017b4a0;
  case 0x44:
switchD_00179ead_caseD_1149:
    pcVar29 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorVUID,pcVar29,(allocator<char> *)&ValidateType);
    std::operator+(&instr_name,"Op",&errorVUID);
    std::__cxx11::string::_M_dispose();
    pIVar30 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar30->inst_).opcode != 0x15) ||
        (uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1), uVar20 != 0x20)) ||
       (uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2), uVar20 != 0)) {
LAB_0017a134:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"The Result Type of ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar29 = " must be OpTypeInt with width 32 and signedness 0.";
      goto LAB_0017a19e;
    }
    uVar35 = (inst->inst_).opcode;
    uVar23 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar35 == 0x1149) | 2);
    pIVar30 = ValidationState_t::FindDef(_,uVar23);
    uVar3 = (pIVar30->inst_).opcode;
    if (uVar35 != 0x1149) {
      if (uVar3 == 0x20) goto LAB_0017b4db;
LAB_0017b5bf:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"The Structure\'s type in ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar29 = " must be a pointer to an OpTypeStruct.";
      goto LAB_0017a19e;
    }
    pIVar30 = inst;
    if (uVar3 == 0x1141) {
LAB_0017b4db:
      uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar30->inst_).opcode != 0x1e) goto LAB_0017b5bf;
      lVar41 = (long)(pIVar30->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar30->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,lVar41 - 1);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar30->inst_).opcode != 0x1d) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"The Structure\'s last member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar29 = " must be an OpTypeRuntimeArray.";
LAB_0017a19e:
        std::operator<<((ostream *)&errorVUID,pcVar29);
        goto LAB_0017a1a6;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar35 == 0x1149) + 3);
      sVar24 = SPV_SUCCESS;
      if (lVar41 - 2U != (ulong)uVar20) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"The array member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar29 = " must be the last member of the struct.";
        goto LAB_0017a19e;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,"Pointer must be an untyped pointer");
LAB_0017a1b8:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
      sVar24 = local_38;
    }
LAB_0017a1bd:
    local_38 = sVar24;
    std::__cxx11::string::_M_dispose();
    goto LAB_0017b4b7;
  default:
    switch(uVar2) {
    case 0x1142:
      goto switchD_00179ead_caseD_1142;
    case 0x1143:
    case 0x1144:
      goto switchD_00179ead_caseD_1143;
    case 0x1145:
    case 0x1146:
      goto switchD_00179ecd_caseD_14f1;
    case 0x1147:
    case 0x1148:
      goto switchD_00179ead_caseD_1147;
    case 0x1149:
      goto switchD_00179ead_caseD_1149;
    }
    switch(uVar2) {
    case 0x14ef:
      local_2a0 = "spv::Op::OpCooperativeMatrixLoadNV";
      pIVar30 = inst;
      break;
    case 0x14f0:
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      local_2a0 = "spv::Op::OpCooperativeMatrixStoreNV";
      break;
    case 0x14f1:
    case 0x14f3:
    case 0x14f4:
    case 0x14f5:
    case 0x14f6:
      goto switchD_00179ecd_caseD_14f1;
    case 0x14f2:
switchD_00179ecd_caseD_14f2:
      pcVar29 = spvOpcodeString(opcode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorVUID,pcVar29,(allocator<char> *)&ValidateType);
      std::operator+(&instr_name,"Op",&errorVUID);
      std::__cxx11::string::_M_dispose();
      pIVar30 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((((pIVar30->inst_).opcode == 0x15) &&
          (uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1), uVar20 == 0x20)) &&
         (uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2), uVar20 == 0)) {
        uVar35 = (inst->inst_).opcode;
        uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar30 = ValidationState_t::FindDef(_,uVar20);
        uVar3 = (pIVar30->inst_).opcode;
        if (uVar35 == 0x116c) {
          if (uVar3 == 0x1168) {
LAB_0017b638:
            sVar24 = SPV_SUCCESS;
            goto LAB_0017a1bd;
          }
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"The type in ");
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID," <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          pcVar29 = " must be OpTypeCooperativeMatrixKHR.";
        }
        else {
          if (uVar3 == 0x14ee) goto LAB_0017b638;
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"The type in ");
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID," <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          pcVar29 = " must be OpTypeCooperativeMatrixNV.";
        }
        goto LAB_0017a19e;
      }
      goto LAB_0017a134;
    case 0x14f7:
      pcVar29 = "spv::Op::OpCooperativeMatrixLoadTensorNV";
      pIVar30 = inst;
      goto LAB_0017a5f3;
    case 0x14f8:
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      pcVar29 = "spv::Op::OpCooperativeMatrixStoreTensorNV";
LAB_0017a5f3:
      uVar23 = (pIVar30->inst_).type_id;
      pIVar30 = ValidationState_t::FindDef(_,uVar23);
      uVar35 = (inst->inst_).opcode;
      if ((pIVar30->inst_).opcode != 0x1168) {
        if (uVar35 == 0x14f7) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
        }
        goto LAB_0017aba4;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar35 == 0x14f7) * 2));
      pIVar31 = ValidationState_t::FindDef(_,uVar20);
      if (pIVar31 == (Instruction *)0x0) {
LAB_0017ae5b:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID," Pointer <id> ");
LAB_0017ae9e:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " is not a logical pointer.";
        goto LAB_0017b03e;
      }
      AVar21 = ValidationState_t::addressing_model(_);
      if (AVar21 == AddressingModelLogical) {
        bVar7 = (_->features_).variable_pointers;
        if ((bool)bVar7 == false) {
          iVar22 = spvOpcodeReturnsLogicalPointer((uint)(pIVar31->inst_).opcode);
          if (iVar22 == 0) goto LAB_0017ae5b;
          bVar7 = (_->features_).variable_pointers;
        }
        if (((bVar7 & 1) != 0) &&
           (bVar18 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar31->inst_).opcode), !bVar18)
           ) goto LAB_0017ae5b;
      }
      id = (pIVar31->inst_).type_id;
      pIVar31 = ValidationState_t::FindDef(_,id);
      if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).opcode != 0x20)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID," type for pointer <id> ");
LAB_0017ad3a:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " is not a pointer type.";
        goto LAB_0017b03e;
      }
      SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
      if (((SVar19 != StorageClassWorkgroup) && (SVar19 != StorageBuffer)) &&
         (SVar19 != PhysicalStorageBuffer)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x230d,(char *)0x0);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        std::operator<<((ostream *)&errorVUID,
                        " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
LAB_0017be50:
        std::__cxx11::string::_M_dispose();
        goto LAB_0017b192;
      }
      if ((inst->inst_).opcode == 0x14f7) {
        uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar31 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).type_id != uVar23)) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,pcVar29);
          std::operator<<((ostream *)&errorVUID," Object <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar29 = " type does not match Result Type.";
          goto LAB_0017b03e;
        }
        sVar38 = (ulong)((inst->inst_).opcode == 0x14f7) * 2 + 2;
      }
      else {
        sVar38 = 2;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,sVar38);
      pIVar31 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar31 == (Instruction *)0x0) ||
         (pIVar33 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id),
         (pIVar33->inst_).opcode != 0x14fa)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID," TensorLayout <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " does not have a tensor layout type.";
        goto LAB_0017b03e;
      }
      uVar20 = (uint)((inst->inst_).opcode == 0x14f7) * 2 + 3;
      if (((ulong)uVar20 <
           (ulong)((long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4)) &&
         (sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20), sVar24 != SPV_SUCCESS)) {
        return sVar24;
      }
      uVar25 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar20);
      iVar26 = anon_unknown_2::MemoryAccessNumWords(uVar25);
      uVar25 = uVar20 + iVar26;
      TVar27 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>(inst,(ulong)uVar25);
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <
          (ulong)((TVar27 & TensorView) + iVar26 + uVar20 + (uint)((TVar27 >> 1 & 1) != 0) + 1)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        pcVar29 = " not enough tensor addressing operands.";
LAB_0017b4a0:
        std::operator<<((ostream *)&errorVUID,pcVar29);
        goto LAB_0017b4b2;
      }
      uVar20 = uVar25 + 1;
      if ((TVar27 & TensorView) != MaskNone) {
        uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar20);
        pIVar33 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar33 != (Instruction *)0x0) &&
           (pIVar33 = ValidationState_t::FindDef(_,(pIVar33->inst_).type_id),
           (pIVar33->inst_).opcode == 0x14fb)) {
          uVar20 = uVar25 + 2;
          goto LAB_0017c201;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID," TensorView <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " does not have a tensor view type.";
        goto LAB_0017b182;
      }
LAB_0017c201:
      if ((TVar27 & DecodeFunc) != MaskNone) {
        if ((inst->inst_).opcode != 0x14f8) {
          uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar20);
          pIVar33 = ValidationState_t::FindDef(_,uVar20);
          if ((pIVar33 == (Instruction *)0x0) || ((pIVar33->inst_).opcode != 0x36)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&errorVUID,pcVar29);
            std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar29 = " is not a function.";
          }
          else {
            uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1);
            sVar38 = 3;
            uVar28 = Instruction::GetOperandAs<unsigned_int>(pIVar33,3);
            pIVar30 = ValidationState_t::FindDef(_,uVar28);
            uVar28 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1);
            if (uVar28 == uVar25) {
              uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
              pIVar33 = ValidationState_t::FindDef(_,uVar25);
              SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar33,1);
              if (SVar19 == PhysicalStorageBuffer) {
                pIVar31 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
                for (; sVar38 != 5; sVar38 = sVar38 + 1) {
                  uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar30,sVar38);
                  pIVar33 = ValidationState_t::FindDef(_,uVar25);
                  if ((pIVar33->inst_).opcode != 0x1c) {
LAB_0017cffa:
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                    std::operator<<((ostream *)&errorVUID,pcVar29);
                    std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
                    ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
                    std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                    std::operator<<((ostream *)&errorVUID,
                                    " second/third parameter must be array of 32-bit integer with ")
                    ;
                    pcVar29 = " dimension equal to the tensor dimension.";
                    goto LAB_0017b03e;
                  }
                  uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar33,2);
                  bVar18 = ValidationState_t::EvalConstantValUint64
                                     (_,uVar25,(uint64_t *)&ValidateType);
                  if (bVar18) {
                    uVar25 = Instruction::GetOperandAs<unsigned_int>(pIVar31,1);
                    bVar18 = ValidationState_t::EvalConstantValUint64
                                       (_,uVar25,(uint64_t *)&data_type);
                    if ((bVar18) && (ValidateType._ != (ValidationState_t *)_data_type))
                    goto LAB_0017cffa;
                  }
                }
                goto switchD_00179ecd_caseD_14f1;
              }
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&errorVUID,pcVar29);
              std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar29 = " first parameter must be pointer to PhysicalStorageBuffer.";
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&errorVUID,pcVar29);
              std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar29 = " return type must match matrix component type.";
            }
          }
          goto LAB_0017b03e;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar29 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
        goto LAB_0017b4a0;
      }
      goto switchD_00179ecd_caseD_14f1;
    default:
      if (uVar2 - 0x191 < 3) {
        AVar21 = ValidationState_t::addressing_model(_);
        if ((AVar21 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = 
          "Instruction cannot for logical addressing model be used without a variable pointers capability"
          ;
        }
        else {
          pIVar30 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
          if ((inst->inst_).opcode == 0x193) {
            if ((pIVar30 == (Instruction *)0x0) || ((pIVar30->inst_).opcode != 0x15)) {
              ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
              pcVar29 = "Result Type must be an integer scalar";
            }
            else {
LAB_0017a1e0:
              uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,2);
              pIVar30 = ValidationState_t::FindDef(_,uVar20);
              uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,3);
              pIVar31 = ValidationState_t::FindDef(_,uVar20);
              if ((pIVar31 == (Instruction *)0x0 || pIVar30 == (Instruction *)0x0) ||
                 (uVar23 = (pIVar30->inst_).type_id, uVar23 != (pIVar31->inst_).type_id)) {
                ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                pcVar29 = "The types of Operand 1 and Operand 2 must match";
              }
              else {
                pIVar30 = ValidationState_t::FindDef(_,uVar23);
                if ((pIVar30 == (Instruction *)0x0) ||
                   ((uVar35 = (pIVar30->inst_).opcode, uVar35 != 0x20 && (uVar35 != 0x1141)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar29 = "Operand type must be a pointer";
                }
                else {
                  SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar30,1);
                  AVar21 = ValidationState_t::addressing_model(_);
                  if (AVar21 == AddressingModelLogical) {
                    if ((SVar19 & ~Generic) == StorageClassWorkgroup) {
                      if ((SVar19 != StorageClassWorkgroup) ||
                         (bVar18 = EnumSet<spv::Capability>::contains
                                             (&_->module_capabilities_,CapabilityVariablePointers),
                         bVar18)) goto switchD_00179ecd_caseD_14f1;
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar29 = 
                      "Workgroup storage class pointer requires VariablePointers capability to be specified"
                      ;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                      pcVar29 = "Invalid pointer storage class";
                    }
                  }
                  else {
                    if (SVar19 != PhysicalStorageBuffer) goto switchD_00179ecd_caseD_14f1;
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar29 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                  }
                }
              }
            }
          }
          else {
            if ((pIVar30 != (Instruction *)0x0) && ((pIVar30->inst_).opcode == 0x14))
            goto LAB_0017a1e0;
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
            pcVar29 = "Result Type must be OpTypeBool";
          }
        }
        goto LAB_0017b4a0;
      }
      if (uVar2 != 0x1169) {
        if (uVar2 == 0x116a) {
          uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar30 = ValidationState_t::FindDef(_,uVar20);
          local_2a0 = "spv::Op::OpCooperativeMatrixStoreKHR";
          goto LAB_0017a740;
        }
        if (opcode == OpCooperativeMatrixLengthKHR) goto switchD_00179ecd_caseD_14f2;
        if (opcode != OpRawAccessChainNV) goto switchD_00179ecd_caseD_14f1;
        _data_type = (pointer)inst;
        pcVar29 = spvOpcodeString(OpRawAccessChainNV);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorVUID,pcVar29,(allocator<char> *)&ValidateType);
        std::operator+(&instr_name,"Op",&errorVUID);
        std::__cxx11::string::_M_dispose();
        pIVar30 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((pIVar30->inst_).opcode == 0x20) {
          SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar30,1);
          if (((SVar19 != StorageClassUniform) && (SVar19 != StorageBuffer)) &&
             (SVar19 != PhysicalStorageBuffer)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Result Type of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar29 = 
            " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
            goto LAB_0017a19e;
          }
          uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar30,2);
          pIVar30 = ValidationState_t::FindDef(_,uVar20);
          uVar20 = (uint)(pIVar30->inst_).opcode;
          if ((uVar20 < 0x1f) && ((0x51000000U >> (uVar20 & 0x1f) & 1) != 0)) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Result Type of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar29 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
            goto LAB_0017a19e;
          }
          uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar30 = ValidationState_t::FindDef(_,uVar20);
          if ((pIVar30->inst_).opcode != 0x2b) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The Stride of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar29 = " must be OpConstant. Found Op";
            goto LAB_0017ac3f;
          }
          pIVar31 = ValidationState_t::FindDef(_,(pIVar30->inst_).type_id);
          if ((pIVar31->inst_).opcode != 0x15) {
            ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&errorVUID,"The type of Stride of ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&ValidateType,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            std::operator<<((ostream *)&errorVUID," must be OpTypeInt. Found Op");
            uVar2 = (pIVar31->inst_).opcode;
            goto LAB_0017ac4d;
          }
          ValidateType.inst = (Instruction **)&data_type;
          ValidateType._ = _;
          ValidateType.instr_name = &instr_name;
          sVar24 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                             (&ValidateType,"Index",4);
          if ((sVar24 == SPV_SUCCESS) &&
             (sVar24 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                                 (&ValidateType,"Offset",5), sVar24 == SPV_SUCCESS)) {
            sVar24 = SPV_SUCCESS;
            if (*(long *)(_data_type + 0x20) - *(size_t *)(_data_type + 0x18) < 0x61)
            goto LAB_0017a1bd;
            uVar20 = Instruction::GetOperandAs<unsigned_int>((Instruction *)_data_type,6);
            if ((uVar20 & 2) == 0) {
LAB_0017ca49:
              if ((uVar20 & 1) == 0) {
                if ((SVar19 == PhysicalStorageBuffer & (byte)((uVar20 & 2) >> 1)) != 0) {
LAB_0017cbfb:
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)_data_type);
                  pcVar29 = 
                  "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                  ;
                  goto LAB_0017cc1d;
                }
              }
              else {
                if (SVar19 == PhysicalStorageBuffer) goto LAB_0017cbfb;
                sVar24 = SPV_SUCCESS;
                if ((uVar20 & 2) != 0) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)_data_type);
                  pcVar29 = 
                  "Per-component robustness and per-element robustness are mutually exclusive.";
                  goto LAB_0017cc1d;
                }
              }
              goto LAB_0017a1bd;
            }
            stride_value = 0;
            bVar18 = ValidationState_t::EvalConstantValUint64
                               (_,(pIVar30->inst_).result_id,&stride_value);
            if ((!bVar18) || (stride_value != 0)) goto LAB_0017ca49;
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)_data_type);
            pcVar29 = "Stride must not be zero when per-element robustness is used.";
LAB_0017cc1d:
            std::operator<<((ostream *)&errorVUID,pcVar29);
            goto LAB_0017a1b8;
          }
          goto LAB_0017a1bd;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&errorVUID,"The Result Type of ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,(inst->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar29 = " must be OpTypePointer. Found Op";
LAB_0017ac3f:
        std::operator<<((ostream *)&errorVUID,pcVar29);
        uVar2 = (pIVar30->inst_).opcode;
LAB_0017ac4d:
        pcVar29 = spvOpcodeString((uint)uVar2);
        std::operator<<((ostream *)&errorVUID,pcVar29);
        std::operator<<((ostream *)&errorVUID,'.');
LAB_0017a1a6:
        std::__cxx11::string::_M_dispose();
        goto LAB_0017a1b8;
      }
      local_2a0 = "spv::Op::OpCooperativeMatrixLoadKHR";
      pIVar30 = inst;
LAB_0017a740:
      uVar23 = (pIVar30->inst_).type_id;
      pIVar30 = ValidationState_t::FindDef(_,uVar23);
      uVar35 = (inst->inst_).opcode;
      if ((pIVar30->inst_).opcode != 0x1168) {
        if (uVar35 == 0x1169) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          pcVar29 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
        }
        goto LAB_0017aba4;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar35 == 0x1169) * 2));
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if (pIVar30 == (Instruction *)0x0) goto LAB_0017af30;
      AVar21 = ValidationState_t::addressing_model(_);
      if (AVar21 == AddressingModelLogical) {
        bVar7 = (_->features_).variable_pointers;
        if ((bool)bVar7 == false) {
          iVar22 = spvOpcodeReturnsLogicalPointer((uint)(pIVar30->inst_).opcode);
          if (iVar22 == 0) goto LAB_0017af30;
          bVar7 = (_->features_).variable_pointers;
        }
        if (((bVar7 & 1) != 0) &&
           (bVar18 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar30->inst_).opcode), !bVar18)
           ) goto LAB_0017af30;
      }
      uVar23 = (pIVar30->inst_).type_id;
      pIVar31 = ValidationState_t::FindDef(_,uVar23);
      if ((pIVar31 == (Instruction *)0x0) ||
         ((uVar35 = (pIVar31->inst_).opcode, uVar35 != 0x20 && (uVar35 != 0x1141))))
      goto LAB_0017a9b0;
      SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
      bVar18 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar18) &&
         (((SVar19 != StorageClassWorkgroup && (SVar19 != StorageBuffer)) &&
          (SVar19 != PhysicalStorageBuffer)))) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x230d,(char *)0x0);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID,local_2a0);
        std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar23);
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        std::operator<<((ostream *)&errorVUID,
                        " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
        goto LAB_0017be50;
      }
      if (uVar35 != 0x1141) {
        uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar31 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar31 != (Instruction *)0x0) &&
           ((bVar18 = ValidationState_t::IsIntScalarOrVectorType(_,uVar20), bVar18 ||
            (bVar18 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar20), bVar18))))
        goto LAB_0017a84d;
        goto LAB_0017b2a1;
      }
LAB_0017a84d:
      uVar20 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar30 == (Instruction *)0x0) ||
         ((bVar18 = ValidationState_t::IsIntScalarType(_,(pIVar30->inst_).type_id), !bVar18 ||
          (iVar22 = spvOpcodeIsConstant((uint)(pIVar30->inst_).opcode), iVar22 == 0)))) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"MemoryLayout operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " must be a 32-bit integer constant instruction.";
        goto LAB_0017b03e;
      }
      bVar18 = ValidationState_t::EvalConstantValUint64(_,uVar20,(uint64_t *)&ValidateType);
      uVar35 = (inst->inst_).opcode;
      sVar38 = (ulong)(uVar35 == 0x1169) + 3;
      uVar40 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar40 <= sVar38) {
        if (bVar18 && ValidateType._ < (ValidationState_t *)0x2) {
          ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&errorVUID,"MemoryLayout ");
          std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
          pcVar29 = " requires a Stride.";
          goto LAB_0017b4a0;
        }
LAB_0017c189:
        uVar20 = uVar35 == 0x1169 | 4;
        if ((uVar40 <= uVar20) ||
           (local_38 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20), local_38 == SPV_SUCCESS)) {
          local_38 = SPV_SUCCESS;
        }
        goto LAB_0017b4b7;
      }
      uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,sVar38);
      pIVar30 = ValidationState_t::FindDef(_,uVar23);
      if ((pIVar30 != (Instruction *)0x0) &&
         (bVar18 = ValidationState_t::IsIntScalarType(_,(pIVar30->inst_).type_id), bVar18)) {
        uVar35 = (inst->inst_).opcode;
        uVar40 = (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        goto LAB_0017c189;
      }
      goto LAB_0017ba91;
    }
    uVar23 = (pIVar30->inst_).type_id;
    pIVar30 = ValidationState_t::FindDef(_,uVar23);
    uVar35 = (inst->inst_).opcode;
    if ((pIVar30->inst_).opcode != 0x14ee) {
      if (uVar35 == 0x14ef) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar29 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        pcVar29 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
      }
LAB_0017aba4:
      std::operator<<((ostream *)&errorVUID,pcVar29);
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = " is not a cooperative matrix type.";
      goto LAB_0017b03e;
    }
    uVar20 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar35 == 0x14ef) * 2));
    pIVar30 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar30 == (Instruction *)0x0) {
LAB_0017af30:
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&errorVUID,local_2a0);
      std::operator<<((ostream *)&errorVUID," Pointer <id> ");
LAB_0017b16b:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar29 = " is not a logical pointer.";
LAB_0017b182:
      std::operator<<((ostream *)&errorVUID,pcVar29);
LAB_0017b192:
      std::__cxx11::string::_M_dispose();
LAB_0017b4b2:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
LAB_0017b4b7:
      if (local_38 != SPV_SUCCESS) {
        return local_38;
      }
    }
    else {
      AVar21 = ValidationState_t::addressing_model(_);
      if (AVar21 == AddressingModelLogical) {
        bVar7 = (_->features_).variable_pointers;
        if ((bool)bVar7 == false) {
          iVar22 = spvOpcodeReturnsLogicalPointer((uint)(pIVar30->inst_).opcode);
          if (iVar22 == 0) goto LAB_0017af30;
          bVar7 = (_->features_).variable_pointers;
        }
        if (((bVar7 & 1) != 0) &&
           (bVar18 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar30->inst_).opcode), !bVar18)
           ) goto LAB_0017af30;
      }
      uVar23 = (pIVar30->inst_).type_id;
      pIVar31 = ValidationState_t::FindDef(_,uVar23);
      if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).opcode != 0x20)) {
LAB_0017a9b0:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,local_2a0);
        std::operator<<((ostream *)&errorVUID," type for pointer <id> ");
LAB_0017a9f2:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " is not a pointer type.";
        goto LAB_0017b182;
      }
      SVar19 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
      if (((SVar19 != StorageClassWorkgroup) && (SVar19 != StorageBuffer)) &&
         (SVar19 != PhysicalStorageBuffer)) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,local_2a0);
        std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " is not Workgroup or StorageBuffer.";
        goto LAB_0017b182;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
      pIVar31 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar31 == (Instruction *)0x0) ||
         ((bVar18 = ValidationState_t::IsIntScalarOrVectorType(_,uVar20), !bVar18 &&
          (bVar18 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar20), !bVar18)))) {
LAB_0017b2a1:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,local_2a0);
        std::operator<<((ostream *)&errorVUID," Pointer <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,(pIVar30->inst_).result_id);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID,"s Type must be a scalar or vector type.");
        std::__cxx11::string::_M_dispose();
        goto LAB_0017b4b2;
      }
      uVar23 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
      pIVar30 = ValidationState_t::FindDef(_,uVar23);
      if ((pIVar30 == (Instruction *)0x0) ||
         (bVar18 = ValidationState_t::IsIntScalarType(_,(pIVar30->inst_).type_id), !bVar18)) {
LAB_0017ba91:
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Stride operand <id> ");
LAB_0017bf00:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar23);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " must be a scalar integer type.";
LAB_0017b03e:
        std::operator<<((ostream *)&errorVUID,pcVar29);
LAB_0017b04d:
        std::__cxx11::string::_M_dispose();
        goto LAB_0017b4b2;
      }
      uVar20 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
      pIVar30 = ValidationState_t::FindDef(_,uVar20);
      if (((pIVar30 == (Instruction *)0x0) ||
          (bVar18 = ValidationState_t::IsBoolScalarType(_,(pIVar30->inst_).type_id), !bVar18)) ||
         ((iVar22 = spvOpcodeIsConstant((uint)(pIVar30->inst_).opcode), iVar22 == 0 &&
          (iVar22 = spvOpcodeIsSpecConstant((uint)(pIVar30->inst_).opcode), iVar22 == 0)))) {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&errorVUID,"Column Major operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar29 = " must be a boolean constant instruction.";
        goto LAB_0017b03e;
      }
      uVar20 = (inst->inst_).opcode == 0x14ef | 4;
      if ((ulong)uVar20 <
          (ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        sVar24 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20);
        break;
      }
    }
    goto switchD_00179ecd_caseD_14f1;
  }
  if (sVar24 == SPV_SUCCESS) {
switchD_00179ecd_caseD_14f1:
    sVar24 = SPV_SUCCESS;
  }
  return sVar24;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}